

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DataBlobImpl> *this,DataBlobImpl *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (DataBlobImpl *)0x0) {
    RefCountedObject<Diligent::IDataBlob>::AddRef((RefCountedObject<Diligent::IDataBlob> *)pObj);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }